

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleAsciiCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar1;
  const_reference pvVar2;
  char *pcVar3;
  allocator local_c9;
  undefined1 local_c8 [8];
  string error;
  int ch;
  string output;
  string outvar;
  size_type cc;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this_01 = local_20;
  if (sVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"No output variable specified",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_01,sVar1 - 1);
    std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8),(string *)pvVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&ch,"",(allocator *)(error.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(error.field_2._M_local_buf + 0xf));
    outvar.field_2._8_8_ = 1;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar1 - 1 <= (ulong)outvar.field_2._8_8_) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_20,outvar.field_2._8_8_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      error.field_2._8_4_ = atoi(pcVar3);
      if (((int)error.field_2._8_4_ < 1) || (0xff < (int)error.field_2._8_4_)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_c8,"Character with code ",&local_c9);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,outvar.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_c8,(string *)pvVar2);
        std::__cxx11::string::operator+=((string *)local_c8," does not exist.");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_c8);
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_c8);
        goto LAB_00623151;
      }
      std::__cxx11::string::operator+=((string *)&ch,error.field_2._M_local_buf[8]);
      outvar.field_2._8_8_ = outvar.field_2._8_8_ + 1;
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)((long)&output.field_2 + 8),pcVar3);
    this_local._7_1_ = 1;
LAB_00623151:
    std::__cxx11::string::~string((string *)&ch);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleAsciiCommand(std::vector<std::string> const& args)
{
  if ( args.size() < 3 )
    {
    this->SetError("No output variable specified");
    return false;
    }
  std::string::size_type cc;
  std::string outvar = args[args.size()-1];
  std::string output = "";
  for ( cc = 1; cc < args.size()-1; cc ++ )
    {
    int ch = atoi(args[cc].c_str());
    if ( ch > 0 && ch < 256 )
      {
      output += static_cast<char>(ch);
      }
    else
      {
      std::string error = "Character with code ";
      error += args[cc];
      error += " does not exist.";
      this->SetError(error);
      return false;
      }
    }
  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}